

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::DirectStateAccess::Textures::GetSetParameterTest::CheckErrorAndLog
          (GetSetParameterTest *this,GLchar *fname,GLenum pname)

{
  int iVar1;
  undefined4 extraout_var;
  size_t sVar2;
  Enum<int,_2UL> local_1c0;
  Enum<int,_2UL> local_1b0;
  undefined1 local_1a0 [8];
  _func_int **local_198;
  ios_base local_128 [264];
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  iVar1 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  if (iVar1 != 0) {
    local_1a0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
    if (fname == (GLchar *)0x0) {
      std::ios::clear((int)(ostringstream *)&local_198 + (int)local_198[-3]);
    }
    else {
      sVar2 = strlen(fname);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,fname,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198," unexpectedly generated error ",0x1e);
    local_1b0.m_getName = glu::getErrorName;
    local_1b0.m_value = iVar1;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1b0,(ostream *)&local_198);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198," during test of pname ",0x16);
    local_1c0.m_getName = glu::getTextureParameterName;
    local_1c0.m_value = pname;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)&local_198);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,". Test fails.",0xd);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
    std::ios_base::~ios_base(local_128);
  }
  return iVar1 == 0;
}

Assistant:

bool GetSetParameterTest::CheckErrorAndLog(const glw::GLchar* fname, glw::GLenum pname)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Check errors. */
	glw::GLenum error;

	if (GL_NO_ERROR != (error = gl.getError()))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << fname << " unexpectedly generated error "
											<< glu::getErrorStr(error) << " during test of pname "
											<< glu::getTextureParameterStr(pname) << ". Test fails."
											<< tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}